

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::renderTexture2DView
               (TestContext *testContext,RenderContext *renderContext,TextureRenderer *renderer,
               ResultCollector *results,Random *rng,deUint32 name,ImageInfo *info,
               Texture2DView *refTexture,Verify verify)

{
  ostringstream *this;
  char *imageSetName;
  char *imageSetDesc;
  pointer pCVar1;
  undefined4 uVar2;
  undefined4 textureTarget;
  int iVar3;
  int x;
  int y;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar9;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  TextureFormat *pTVar10;
  TextureFormat TVar11;
  allocator_type *__a;
  int iVar12;
  int iVar13;
  void *pvVar14;
  ChannelType height;
  int iVar15;
  int iVar16;
  ulong uVar17;
  RGBA threshold;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  Vector<unsigned_int,_4> res_1;
  TextureImageIterator imageIterator;
  vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
  cellContents;
  TextureFormat format;
  Vector<int,_2> res;
  TextureFormatInfo spec;
  uint local_414;
  Surface local_3e0;
  undefined1 local_3c8 [8];
  TextureFormat TStack_3c0;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int local_3ac;
  void *local_3a8;
  RenderContext *local_3a0;
  pointer local_398;
  ulong local_390;
  TextureFormat local_388;
  TextureFormat local_380;
  undefined1 local_378 [48];
  undefined1 local_348 [40];
  int local_320;
  int local_31c;
  long local_318;
  deRandom *local_310;
  ResultCollector *local_308;
  TextureRenderer *local_300;
  IVec2 local_2f8;
  TextureFormat local_2f0;
  size_type sStack_2e8;
  RandomizedRenderGrid local_2e0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
  local_2b8;
  TextureFormat local_2a0;
  undefined1 local_298 [8];
  TextureFormat local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  void *local_278;
  ios_base local_220 [264];
  ImageInfo local_118;
  ReferenceParams local_104;
  TextureFormatInfo local_70;
  long lVar8;
  
  local_388 = (TextureFormat)testContext;
  local_310 = &rng->m_rnd;
  local_308 = results;
  local_300 = renderer;
  iVar5 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar8 = CONCAT44(extraout_var,iVar5);
  local_2a0 = refTexture->m_levels->m_format;
  tcu::getTextureFormatInfo(&local_70,&local_2a0);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_104,TEXTURETYPE_2D);
  local_118.m_format = info->m_format;
  local_118.m_target = info->m_target;
  local_118.m_size.m_data._0_8_ = *(undefined8 *)(info->m_size).m_data;
  local_118.m_size.m_data[2] = (info->m_size).m_data[2];
  iVar5 = getLevelCount(info);
  TextureImageIterator::TextureImageIterator((TextureImageIterator *)local_348,&local_118,iVar5);
  local_104.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(local_2a0);
  local_104.sampler.wrapS = CLAMP_TO_EDGE;
  local_104.sampler.wrapT = CLAMP_TO_EDGE;
  local_104.sampler.wrapR = CLAMP_TO_EDGE;
  local_104.sampler.minFilter = NEAREST_MIPMAP_NEAREST;
  local_104.sampler.magFilter = NEAREST;
  local_104.sampler.lodThreshold = 0.0;
  local_104.sampler.normalizedCoords = true;
  local_104.sampler.compare = COMPAREMODE_NONE;
  local_104.sampler.compareChannel = 0;
  local_104.sampler.borderColor.v._0_8_ = 0;
  local_104.sampler.borderColor.v._8_8_ = 0;
  local_104.sampler.seamlessCubeMap = false;
  local_104.sampler._53_3_ = 0;
  local_104.sampler.depthStencilMode = MODE_DEPTH;
  local_104.super_RenderParams.colorScale.m_data[0] = local_70.lookupScale.m_data[0];
  local_104.super_RenderParams.colorScale.m_data[1] = local_70.lookupScale.m_data[1];
  local_104.super_RenderParams.colorScale.m_data[2] = local_70.lookupScale.m_data[2];
  local_104.super_RenderParams.colorScale.m_data[3] = local_70.lookupScale.m_data[3];
  local_104.super_RenderParams.colorBias.m_data[0] = local_70.lookupBias.m_data[0];
  local_104.super_RenderParams.colorBias.m_data[1] = local_70.lookupBias.m_data[1];
  local_104.super_RenderParams.colorBias.m_data[2] = local_70.lookupBias.m_data[2];
  local_104.super_RenderParams.colorBias.m_data[3] = local_70.lookupBias.m_data[3];
  (**(code **)(lVar8 + 8))(0x84c0);
  (**(code **)(lVar8 + 0xb8))(0xde1,name);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Failed to bind texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x4df);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2801,0x2700);
  (**(code **)(lVar8 + 0x1360))(0xde1,0x2800,0x2600);
  local_318 = lVar8;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Failed to setup texture filtering state.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x4e5);
  iVar5 = (*renderContext->_vptr_RenderContext[4])(renderContext);
  local_3a0 = renderContext;
  iVar7 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar8 = CONCAT44(extraout_var_01,iVar7);
  local_2f8.m_data = *(int (*) [2])CONCAT44(extraout_var_00,iVar5);
  if (((int)local_348._24_4_ < local_31c + -1) || (local_320 < local_348._0_4_ + -1)) {
    do {
      iVar5 = (local_31c - local_348._24_4_) * local_348._0_4_;
      local_298 = (undefined1  [8])local_348._28_8_;
      dVar6 = deRandom_getUint32(local_310);
      uVar17 = (ulong)dVar6;
      RandomizedRenderGrid::RandomizedRenderGrid
                (&local_2e0,&local_2f8,(IVec2 *)local_298,iVar5,dVar6);
      iVar5 = local_2e0.m_cellCount;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
      ::vector(&local_2b8,(long)local_2e0.m_cellCount,__a);
      y = local_2e0.m_baseRandomOffset.m_data[1];
      x = local_2e0.m_baseRandomOffset.m_data[0];
      iVar3 = local_2e0.m_cellSize.m_data[1];
      iVar7 = local_2e0.m_cellSize.m_data[0];
      if (local_2e0.m_currentCell < iVar5) {
        local_390 = (ulong)(uint)local_2e0.m_grid.m_data[0];
        local_414 = 0;
        local_398 = local_2b8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        iVar16 = local_2e0.m_currentCell;
        do {
          bVar4 = TextureImageIterator::nextImage((TextureImageIterator *)local_348);
          textureTarget = local_348._24_4_;
          uVar2 = local_348._8_4_;
          if (!bVar4) {
            iVar5 = iVar16 + 1;
            break;
          }
          local_380.order = local_348._28_4_;
          local_380.type = local_348._32_4_;
          iVar15 = iVar16 / (int)local_390;
          iVar12 = iVar16 % (int)local_390;
          local_3c8._0_4_ = R;
          local_3c8._4_4_ = SNORM_INT8;
          TStack_3c0.order = R;
          TStack_3c0.type = SNORM_INT8;
          local_3b8 = 0;
          iStack_3b4 = 0;
          local_104.baseLevel = local_348._24_4_;
          local_104.maxLevel = local_348._24_4_;
          (**(code **)(lVar8 + 0x1360))(local_348._8_4_,0x813c,local_348._24_4_);
          (**(code **)(lVar8 + 0x1360))(uVar2,0x813d,textureTarget);
          computeQuadTexCoords
                    ((vector<float,_std::allocator<float>_> *)local_3c8,
                     (TextureImageIterator *)local_348);
          iVar13 = iVar12 * iVar7 + x;
          iVar15 = iVar15 * iVar3 + y;
          height = local_380.type;
          (**(code **)(lVar8 + 0x1a00))(iVar13,iVar15,local_380,(ulong)local_380 >> 0x20);
          deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                    (local_300,0,(float *)local_3c8,&local_104.super_RenderParams);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"Failed to render.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                          ,0x499);
          iVar12 = local_320;
          pCVar1 = local_398;
          if (verify == VERIFY_COMPARE_REFERENCE) {
            lVar9 = (long)(int)local_414;
            *(ulong *)local_398[lVar9].origin.m_data = CONCAT44(iVar15,iVar13);
            Functional::(anonymous_namespace)::getTextureImageName_abi_cxx11_
                      ((string *)local_298,(_anonymous_namespace_ *)(ulong)(uint)uVar2,textureTarget
                       ,local_320,(int)uVar17);
            std::__cxx11::string::operator=((string *)&pCVar1[lVar9].name,(string *)local_298);
            if (local_298 != (undefined1  [8])((long)local_298 + 0x10)) {
              operator_delete((void *)local_298,
                              CONCAT44(local_288._M_allocated_capacity._4_4_,
                                       local_288._M_allocated_capacity._0_4_) + 1);
            }
            Functional::(anonymous_namespace)::getTextureImageDescription_abi_cxx11_
                      ((string *)local_298,(_anonymous_namespace_ *)(ulong)(uint)uVar2,textureTarget
                       ,iVar12,(int)uVar17);
            std::__cxx11::string::operator=
                      ((string *)&pCVar1[lVar9].description,(string *)local_298);
            if (local_298 != (undefined1  [8])((long)local_298 + 0x10)) {
              operator_delete((void *)local_298,
                              CONCAT44(local_288._M_allocated_capacity._4_4_,
                                       local_288._M_allocated_capacity._0_4_) + 1);
            }
            tcu::Surface::setSize(&pCVar1[lVar9].reference,local_380.order,height);
            iVar12 = (*local_3a0->_vptr_RenderContext[4])();
            tcu::SurfaceAccess::SurfaceAccess
                      ((SurfaceAccess *)local_298,&pCVar1[lVar9].reference,
                       (PixelFormat *)(CONCAT44(extraout_var_02,iVar12) + 8));
            glu::TextureTestUtil::sampleTexture
                      ((SurfaceAccess *)local_298,refTexture,(float *)local_3c8,&local_104);
            local_414 = local_414 + 1;
          }
          if ((TextureFormat)local_3c8 != (TextureFormat)0x0) {
            operator_delete((void *)local_3c8,CONCAT44(iStack_3b4,local_3b8) - (long)local_3c8);
          }
          iVar16 = iVar16 + 1;
        } while (iVar5 != iVar16);
        if (0 < (int)local_414) {
          iVar12 = (int)local_390;
          iVar16 = iVar5 + 1;
          if (iVar12 <= iVar5 + 1) {
            iVar16 = iVar12;
          }
          tcu::Surface::Surface(&local_3e0,iVar16 * iVar7,iVar3 * ((iVar5 + iVar12 + -1) / iVar12));
          local_3c8._0_4_ = RGBA;
          local_3c8._4_4_ = UNORM_INT8;
          pvVar14 = (void *)local_3e0.m_pixels.m_cap;
          if ((void *)local_3e0.m_pixels.m_cap != (void *)0x0) {
            pvVar14 = local_3e0.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_298,(TextureFormat *)local_3c8,local_3e0.m_width,
                     local_3e0.m_height,1,pvVar14);
          glu::readPixels(local_3a0,x,y,(PixelBufferAccess *)local_298);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"Failed to read pixels.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                          ,0x4b2);
          uVar17 = (ulong)local_414;
          __rhs = &local_398->description;
          do {
            iVar5 = *(int *)&__rhs[-2]._M_dataplus._M_p;
            iVar7 = *(int *)((long)&__rhs[-2]._M_dataplus._M_p + 4);
            local_2f0.order = RGBA;
            local_2f0.type = UNORM_INT8;
            pvVar14 = (void *)local_3e0.m_pixels.m_cap;
            if ((void *)local_3e0.m_pixels.m_cap != (void *)0x0) {
              pvVar14 = local_3e0.m_pixels.m_ptr;
            }
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_378,&local_2f0,local_3e0.m_width,
                       local_3e0.m_height,1,pvVar14);
            tcu::getSubregion((PixelBufferAccess *)local_298,(PixelBufferAccess *)local_378,
                              iVar5 - x,iVar7 - y,(int)__rhs[-2]._M_string_length,
                              *(int *)((long)&__rhs[-2]._M_string_length + 4));
            local_3c8 = local_298;
            local_3b8 = local_288._M_allocated_capacity._0_4_;
            TStack_3c0 = local_290;
            local_3ac = local_288._12_4_;
            iStack_3b4 = local_288._M_allocated_capacity._4_4_;
            iStack_3b0 = local_288._8_4_;
            local_3a8 = local_278;
            imageSetName = __rhs[-1]._M_dataplus._M_p;
            imageSetDesc = (__rhs->_M_dataplus)._M_p;
            local_378._0_4_ = RGBA;
            local_378._4_4_ = UNORM_INT8;
            pvVar14 = *(void **)((long)&__rhs[-2].field_2 + 8);
            if (pvVar14 != (void *)0x0) {
              pvVar14 = (void *)__rhs[-2].field_2._M_allocated_capacity;
            }
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)local_298,(TextureFormat *)local_378,
                       (int)__rhs[-2]._M_string_length,
                       *(int *)((long)&__rhs[-2]._M_string_length + 4),1,pvVar14);
            tcu::RGBA::toIVec((RGBA *)&local_2f0);
            local_378._0_4_ = local_2f0.order;
            local_378._4_4_ = local_2f0.type;
            local_378._8_8_ = sStack_2e8;
            bVar4 = tcu::intThresholdCompare
                              ((TestLog *)local_388,imageSetName,imageSetDesc,
                               (ConstPixelBufferAccess *)local_298,
                               (ConstPixelBufferAccess *)local_3c8,(UVec4 *)local_378,
                               COMPARE_LOG_ON_ERROR);
            if (bVar4) {
              local_298._0_4_ = local_388.order;
              local_298._4_4_ = local_388.type;
              this = (ostringstream *)(local_298 + 8);
              std::__cxx11::ostringstream::ostringstream(this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,"Image comparison of ",0x14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,(__rhs->_M_dataplus)._M_p,__rhs->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," passed.",8);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this);
              std::ios_base::~ios_base(local_220);
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_378,"Image comparison of ",__rhs);
              pTVar10 = (TextureFormat *)std::__cxx11::string::append((char *)local_378);
              local_298 = (undefined1  [8])((long)local_298 + 0x10);
              TVar11 = (TextureFormat)(pTVar10 + 2);
              if (*pTVar10 == TVar11) {
                local_288._M_allocated_capacity._0_4_ = (undefined4)*(long *)TVar11;
                local_288._M_allocated_capacity._4_4_ = (undefined4)((ulong)*(long *)TVar11 >> 0x20)
                ;
                local_288._8_4_ = pTVar10[3].order;
                local_288._12_4_ = pTVar10[3].type;
              }
              else {
                local_288._M_allocated_capacity._0_4_ = (undefined4)*(long *)TVar11;
                local_288._M_allocated_capacity._4_4_ = (undefined4)((ulong)*(long *)TVar11 >> 0x20)
                ;
                local_298 = (undefined1  [8])*pTVar10;
              }
              local_290 = pTVar10[1];
              *pTVar10 = TVar11;
              pTVar10[1].order = R;
              pTVar10[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar10[2].order = R;
              tcu::ResultCollector::fail(local_308,(string *)local_298);
              if (local_298 != (undefined1  [8])((long)local_298 + 0x10)) {
                operator_delete((void *)local_298,
                                CONCAT44(local_288._M_allocated_capacity._4_4_,
                                         local_288._M_allocated_capacity._0_4_) + 1);
              }
              if (local_378._0_8_ != (long)local_378 + 0x10) {
                operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
              }
            }
            __rhs = __rhs + 3;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
          tcu::Surface::~Surface(&local_3e0);
        }
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
      ::~vector(&local_2b8);
    } while (((int)local_348._24_4_ < local_31c + -1) || (local_320 < local_348._0_4_ + -1));
  }
  (**(code **)(lVar8 + 0x1360))(local_348._8_4_,0x813c,0);
  (**(code **)(lVar8 + 0x1360))(local_348._8_4_,0x813d,1000);
  lVar8 = local_318;
  (**(code **)(local_318 + 0xb8))(0xde1,0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Failed to unbind texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x4ea);
  return;
}

Assistant:

void renderTexture2DView (tcu::TestContext&			testContext,
						  glu::RenderContext&		renderContext,
						  TextureRenderer&			renderer,
						  tcu::ResultCollector&		results,
						  de::Random&				rng,
						  deUint32					name,
						  const ImageInfo&			info,
						  const tcu::Texture2DView&	refTexture,
						  Verify					verify)
{
	tcu::TestLog&					log				= testContext.getLog();
	const glw::Functions&			gl				= renderContext.getFunctions();
	const tcu::TextureFormat		format			= refTexture.getLevel(0).getFormat();
	const tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(format);

	ReferenceParams					renderParams	(TEXTURETYPE_2D);
	TextureImageIterator			imageIterator	(info, getLevelCount(info));

	renderParams.samplerType	= getSamplerType(format);
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST_MIPMAP_NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to bind texture.");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup texture filtering state.");

	renderTexture<tcu::Texture2DView>(renderContext, renderer, renderParams, results, rng, refTexture, verify, imageIterator, log);

	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unbind texture.");
}